

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

BBox * __thiscall CMU462::DynamicScene::Sphere::get_bbox(Sphere *this)

{
  BBox *in_RDI;
  double in_stack_00000030;
  double in_stack_00000038;
  double in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  double in_stack_00000058;
  BBox *in_stack_00000060;
  
  BBox::BBox(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
             in_stack_00000040,in_stack_00000038,in_stack_00000030);
  return in_RDI;
}

Assistant:

BBox Sphere::get_bbox() {
  return BBox(p.x - r, p.y - r, p.z - r, p.x + r, p.y + r, p.z + r);
}